

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O2

void __thiscall ExprWriter::visit(ExprWriter *this,AggregateInitializer *expr)

{
  pointer ppEVar1;
  Expr **val;
  pointer ppEVar2;
  
  std::operator<<(this->ss,"{");
  ppEVar1 = (expr->values).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar2 = (expr->values).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppEVar2 != ppEVar1; ppEVar2 = ppEVar2 + 1) {
    (*(*ppEVar2)->_vptr_Expr[2])(*ppEVar2,this);
    std::operator<<(this->ss,",");
  }
  std::operator<<(this->ss,"}");
  return;
}

Assistant:

void ExprWriter::visit(AggregateInitializer& expr) {
    ss << "{";
    for (auto& val : expr.values) {
        val->accept(*this);
        ss << ",";
    }
    ss << "}";
}